

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLog>
               (GetterXsYs<int> *getter,TransformerLogLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ImPlotPlot *pIVar7;
  double dVar8;
  double dVar9;
  ImPlotContext *pIVar10;
  ImPlotContext *pIVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ImPlotContext *gp;
  float fVar15;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLogLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar10 = GImPlot;
  pIVar7 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar7->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar13 = getter->Count;
    local_48 = iVar13 + -1;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    lVar12 = (long)((getter->Offset % iVar13 + iVar13) % iVar13) * (long)getter->Stride;
    iVar13 = *(int *)((long)getter->Ys + lVar12);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar8 = log10((double)*(int *)((long)getter->Xs + lVar12) / (pIVar7->XAxis).Range.Min);
    dVar3 = pIVar10->LogDenX;
    pIVar7 = pIVar10->CurrentPlot;
    dVar4 = (pIVar7->XAxis).Range.Min;
    dVar5 = (pIVar7->XAxis).Range.Max;
    dVar9 = log10((double)iVar13 / pIVar7->YAxis[transformer->YAxis].Range.Min);
    iVar13 = transformer->YAxis;
    pIVar7 = pIVar10->CurrentPlot;
    dVar6 = pIVar7->YAxis[iVar13].Range.Min;
    local_3c.x = (float)((((double)(float)(dVar8 / dVar3) * (dVar5 - dVar4) + dVar4) -
                         (pIVar7->XAxis).Range.Min) * pIVar10->Mx +
                        (double)pIVar10->PixelRange[iVar13].Min.x);
    local_3c.y = (float)((((double)(float)(dVar9 / pIVar10->LogDenY[iVar13]) *
                           (pIVar7->YAxis[iVar13].Range.Max - dVar6) + dVar6) - dVar6) *
                         pIVar10->My[iVar13] + (double)pIVar10->PixelRange[iVar13].Min.y);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLog>>
              ((LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLog> *)local_58,
               local_60,&pIVar7->PlotRect);
  }
  else {
    iVar13 = getter->Count;
    lVar12 = (long)((getter->Offset % iVar13 + iVar13) % iVar13) * (long)getter->Stride;
    iVar13 = *(int *)((long)getter->Ys + lVar12);
    dVar8 = log10((double)*(int *)((long)getter->Xs + lVar12) / (pIVar7->XAxis).Range.Min);
    dVar3 = pIVar10->LogDenX;
    pIVar7 = pIVar10->CurrentPlot;
    dVar4 = (pIVar7->XAxis).Range.Min;
    dVar5 = (pIVar7->XAxis).Range.Max;
    dVar9 = log10((double)iVar13 / pIVar7->YAxis[transformer->YAxis].Range.Min);
    iVar13 = transformer->YAxis;
    pIVar7 = pIVar10->CurrentPlot;
    dVar6 = pIVar7->YAxis[iVar13].Range.Min;
    local_58._0_4_ =
         (undefined4)
         ((((double)(float)(dVar8 / dVar3) * (dVar5 - dVar4) + dVar4) - (pIVar7->XAxis).Range.Min) *
          pIVar10->Mx + (double)pIVar10->PixelRange[iVar13].Min.x);
    local_58._4_4_ =
         (float)((((double)(float)(dVar9 / pIVar10->LogDenY[iVar13]) *
                   (pIVar7->YAxis[iVar13].Range.Max - dVar6) + dVar6) - dVar6) * pIVar10->My[iVar13]
                + (double)pIVar10->PixelRange[iVar13].Min.y);
    iVar13 = getter->Count;
    if (1 < iVar13) {
      iVar14 = 1;
      do {
        pIVar11 = GImPlot;
        lVar12 = (long)(((getter->Offset + iVar14) % iVar13 + iVar13) % iVar13) *
                 (long)getter->Stride;
        iVar13 = *(int *)((long)getter->Ys + lVar12);
        dVar8 = log10((double)*(int *)((long)getter->Xs + lVar12) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar3 = pIVar11->LogDenX;
        pIVar7 = pIVar11->CurrentPlot;
        dVar4 = (pIVar7->XAxis).Range.Min;
        dVar5 = (pIVar7->XAxis).Range.Max;
        dVar9 = log10((double)iVar13 / pIVar7->YAxis[transformer->YAxis].Range.Min);
        iVar13 = transformer->YAxis;
        pIVar7 = pIVar11->CurrentPlot;
        dVar6 = pIVar7->YAxis[iVar13].Range.Min;
        local_68.x = (float)((((double)(float)(dVar8 / dVar3) * (dVar5 - dVar4) + dVar4) -
                             (pIVar7->XAxis).Range.Min) * pIVar11->Mx +
                            (double)pIVar11->PixelRange[iVar13].Min.x);
        fVar15 = (float)((((double)(float)(dVar9 / pIVar11->LogDenY[iVar13]) *
                           (pIVar7->YAxis[iVar13].Range.Max - dVar6) + dVar6) - dVar6) *
                         pIVar11->My[iVar13] + (double)pIVar11->PixelRange[iVar13].Min.y);
        local_68.y = fVar15;
        pIVar7 = pIVar10->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar15 <= (float)local_58._4_4_) {
          fVar2 = fVar15;
        }
        if ((fVar2 < (pIVar7->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar15 <= (float)local_58._4_4_) & (uint)fVar15 |
                           local_58._4_4_ & -(uint)(fVar15 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar7->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_68.x <= (float)local_58._0_4_) {
            fVar2 = local_68.x;
          }
          if ((fVar2 < (pIVar7->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_68.x <= (float)local_58._0_4_) & (uint)local_68.x |
                             local_58._0_4_ & -(uint)(local_68.x <= (float)local_58._0_4_)),
             (pIVar7->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar7->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,col,line_weight);
          }
        }
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
        iVar14 = iVar14 + 1;
        iVar13 = getter->Count;
      } while (iVar14 < iVar13);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}